

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O0

void __thiscall SCCTest_TwoAndTwo_Test::TestBody(SCCTest_TwoAndTwo_Test *this)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  __l_01;
  bool bVar1;
  char *message;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_1a8;
  AssertHelper local_170;
  Message local_168;
  allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  local_15d;
  less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_> local_15c;
  undefined1 local_15b;
  allocator<unsigned_int> local_15a;
  less<unsigned_int> local_159;
  uint local_158 [2];
  iterator local_150;
  size_type local_148;
  allocator<unsigned_int> local_13a;
  less<unsigned_int> local_139;
  uint local_138 [2];
  iterator local_130;
  size_type local_128;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_120;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_118;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_e8;
  iterator local_b8;
  size_type local_b0;
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  local_a8;
  SCCSet local_78;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  undefined1 local_28 [8];
  Graph_conflict1 graph;
  SCCTest_TwoAndTwo_Test *this_local;
  
  graph.graph.
  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Graph::Graph((Graph *)local_28,4);
  Graph::addEdge((Graph *)local_28,0,1);
  Graph::addEdge((Graph *)local_28,1,0);
  Graph::addEdge((Graph *)local_28,2,3);
  Graph::addEdge((Graph *)local_28,3,2);
  Graph::addEdge((Graph *)local_28,1,2);
  getSCCs(&local_78,(Graph_conflict1 *)local_28);
  local_15b = 1;
  local_138[0] = 0;
  local_138[1] = 1;
  local_130 = local_138;
  local_128 = 2;
  local_120 = &local_118;
  std::allocator<unsigned_int>::allocator(&local_13a);
  __l_00._M_len = local_128;
  __l_00._M_array = local_130;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&local_118,__l_00,&local_139,&local_13a);
  local_158[0] = 2;
  local_158[1] = 3;
  local_150 = local_158;
  local_148 = 2;
  local_120 = &local_e8;
  std::allocator<unsigned_int>::allocator(&local_15a);
  __l._M_len = local_148;
  __l._M_array = local_150;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&local_e8,__l,&local_159,&local_15a);
  local_15b = 0;
  local_b8 = &local_118;
  local_b0 = 2;
  std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::
  allocator(&local_15d);
  __l_01._M_len = local_b0;
  __l_01._M_array = local_b8;
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::set(&local_a8,__l_01,&local_15c,&local_15d);
  testing::internal::EqHelper::
  Compare<std::set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_nullptr>
            ((EqHelper *)local_48,"getSCCs(graph)","(SCCSet{{0, 1}, {2, 3}})",&local_78,&local_a8);
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~set(&local_a8);
  std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::
  ~allocator(&local_15d);
  local_1a8 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_b8
  ;
  do {
    local_1a8 = local_1a8 + -1;
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(local_1a8);
  } while (local_1a8 != &local_118);
  std::allocator<unsigned_int>::~allocator(&local_15a);
  std::allocator<unsigned_int>::~allocator(&local_13a);
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~set(&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
               ,0xfd,message);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  Graph::~Graph((Graph *)local_28);
  return;
}

Assistant:

TEST(SCCTest, TwoAndTwo) {
  // 0 <-> 1 -> 2 <-> 3
  Graph graph(4);
  graph.addEdge(0, 1);
  graph.addEdge(1, 0);
  graph.addEdge(2, 3);
  graph.addEdge(3, 2);
  // New from previous, doesn't affect result
  graph.addEdge(1, 2);
  EXPECT_EQ(getSCCs(graph), (SCCSet{{0, 1}, {2, 3}}));
}